

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

void vmsa_ttbr_write(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,uint64_t value)

{
  uint64_t uVar1;
  CPUARMState_conflict *__mptr;
  
  if ((ri->state == 1) || ((ri->type & 4) != 0)) {
    uVar1 = raw_read(env,ri);
    if ((uVar1 ^ value) >> 0x30 != 0) {
      tlb_flush_aarch64((CPUState *)(env[-4].vfp.zregs[0x17].d + 0x14));
    }
  }
  raw_write(env,ri,value);
  return;
}

Assistant:

static void vmsa_ttbr_write(CPUARMState *env, const ARMCPRegInfo *ri,
                            uint64_t value)
{
    /* If the ASID changes (with a 64-bit write), we must flush the TLB.  */
    if (cpreg_field_is_64bit(ri) &&
        extract64(raw_read(env, ri) ^ value, 48, 16) != 0) {
        ARMCPU *cpu = env_archcpu(env);
        tlb_flush(CPU(cpu));
    }
    raw_write(env, ri, value);
}